

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  long lVar2;
  ulong uVar3;
  __int_type_conflict _Var4;
  __int_type_conflict _Var5;
  uint uVar6;
  write_guard wVar7;
  write_guard wVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar12;
  pthread_t pVar13;
  basic_node_ptr<unodb::detail::olc_node_header> bVar14;
  uint uVar15;
  void *extraout_RDX;
  ushort uVar16;
  optimistic_lock *poVar17;
  byte child_to_delete;
  undefined1 auVar18 [16];
  __atomic_base<unsigned_long> local_80;
  write_guard node_guard;
  write_guard local_58;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard local_38;
  write_guard child_guard;
  
  auVar18[1] = key_byte;
  auVar18[0] = key_byte;
  auVar18[2] = key_byte;
  auVar18[3] = key_byte;
  auVar18[4] = key_byte;
  auVar18[5] = key_byte;
  auVar18[6] = key_byte;
  auVar18[7] = key_byte;
  auVar18[8] = key_byte;
  auVar18[9] = key_byte;
  auVar18[10] = key_byte;
  auVar18[0xb] = key_byte;
  auVar18[0xc] = key_byte;
  auVar18[0xd] = key_byte;
  auVar18[0xe] = key_byte;
  auVar18[0xf] = key_byte;
  auVar18 = vpcmpeqb_avx(auVar18,ZEXT416((uint)(inode->
                                               super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                                               ).keys));
  uVar15 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) &
           ~(-1 << ((inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).
                    field_0x20 & 0x1f));
  uVar6 = 0;
  if (uVar15 != 0) {
    for (; (uVar15 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  piVar12 = (inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).children.
            _M_elems + uVar6;
  if (uVar15 == 0) {
    poVar17 = parent_critical_section->lock;
    _Var4 = (parent_critical_section->version).version;
    if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
    _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var4 != _Var5) {
      LOCK();
      paVar1 = &poVar17->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
      if (_Var4 != _Var5) {
LAB_0022b36b:
        parent_critical_section->lock = (optimistic_lock *)0x0;
        goto LAB_0022b334;
      }
    }
    LOCK();
    paVar1 = &poVar17->read_lock_count;
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    if (_Var4 != _Var5) goto LAB_0022b334;
    poVar17 = node_critical_section->lock;
    _Var4 = (node_critical_section->version).version;
    if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
    _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
    if (_Var4 == _Var5) {
LAB_0022b127:
      LOCK();
      paVar1 = &poVar17->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_0022b54c:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
    }
    else {
      LOCK();
      paVar1 = &poVar17->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
      if (_Var4 == _Var5) goto LAB_0022b127;
    }
    bVar9 = _Var4 == _Var5;
    node_critical_section->lock = (optimistic_lock *)0x0;
LAB_0022b217:
    uVar16 = (ushort)bVar9;
    uVar10 = 0;
  }
  else {
    child->tagged_ptr = (piVar12->value)._M_i.tagged_ptr;
    bVar9 = optimistic_lock::check
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    if (bVar9) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff80);
      child_critical_section->lock = (optimistic_lock *)local_80._M_i;
      local_80._M_i = 0;
      (child_critical_section->version).version = (version_tag_type)node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffff80);
      if (child_critical_section->lock != (optimistic_lock *)0x0) {
        uVar3 = child->tagged_ptr;
        *child_type = (node_type)uVar3 & (I256|I48);
        if ((uVar3 & 7) != 0) {
          *child_in_parent = piVar12;
          poVar17 = parent_critical_section->lock;
          _Var4 = (parent_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
          _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == _Var5) {
LAB_0022b0a7:
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
          }
          else {
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
            if (_Var4 == _Var5) goto LAB_0022b0a7;
          }
          uVar16 = (ushort)(_Var4 == _Var5);
          parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0022b0c3:
          uVar10 = 1;
          goto LAB_0022b219;
        }
        iVar11 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                           ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                            (uVar3 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
        if (iVar11 != 0) {
          poVar17 = parent_critical_section->lock;
          _Var4 = (parent_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
          _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var4 != _Var5) {
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
            if (_Var4 != _Var5) {
              parent_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_0022b334;
            }
          }
          LOCK();
          paVar1 = &poVar17->read_lock_count;
          lVar2 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var4 != _Var5) goto LAB_0022b334;
          poVar17 = node_critical_section->lock;
          _Var4 = (node_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
          _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var4 != _Var5) {
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
            if (_Var4 != _Var5) {
              node_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_0022b334;
            }
          }
          LOCK();
          paVar1 = &poVar17->read_lock_count;
          lVar2 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
          node_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var4 != _Var5) goto LAB_0022b334;
          poVar17 = child_critical_section->lock;
          _Var4 = (child_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_0022b56b:
            __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
          }
          _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var4 == _Var5) {
LAB_0022b1fb:
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
          }
          else {
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
            if (_Var4 == _Var5) goto LAB_0022b1fb;
          }
          bVar9 = _Var4 == _Var5;
          child_critical_section->lock = (optimistic_lock *)0x0;
          goto LAB_0022b217;
        }
        child_to_delete = -(uVar15 == 0) | (byte)uVar6;
        if ((inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).field_0x20
            == '\x02') {
          bVar9 = optimistic_lock::try_upgrade_to_write_lock
                            (parent_critical_section->lock,
                             (version_type)(parent_critical_section->version).version);
          local_38.lock = (optimistic_lock *)0x0;
          if (bVar9) {
            local_38.lock = parent_critical_section->lock;
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (local_38.lock != (optimistic_lock *)0x0) {
            bVar9 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            child_guard_1.lock = (optimistic_lock *)0x0;
            if (bVar9) {
              child_guard_1.lock = node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if (child_guard_1.lock != (optimistic_lock *)0x0) {
              bVar9 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              wVar8.lock = child_guard_1.lock;
              poVar17 = (optimistic_lock *)0x0;
              if (bVar9) {
                poVar17 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_58.lock = poVar17;
              if (poVar17 != (optimistic_lock *)0x0) {
                local_80._M_i = (__int_type_conflict)db_instance;
                node_guard.lock = (optimistic_lock *)inode;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(child_guard_1.lock)->version);
                pVar13 = pthread_self();
                wVar7.lock = local_58.lock;
                ((wVar8.lock)->obsoleter_thread)._M_thread = pVar13;
                child_guard_1.lock = (optimistic_lock *)0x0;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(local_58.lock)->version);
                ((wVar7.lock)->obsoleter_thread)._M_thread = pVar13;
                local_58.lock = (optimistic_lock *)0x0;
                bVar14 = olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         ::leave_last_child((olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                                             *)node_guard.lock,child_to_delete,db_instance);
                (node_in_parent->value)._M_i.tagged_ptr = bVar14.tagged_ptr;
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62e,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                               );
                }
                if (local_58.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62f,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                               );
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                std::
                unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffff80);
                optimistic_lock::write_guard::~write_guard(&local_58);
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
                optimistic_lock::write_guard::~write_guard(&local_38);
                if (poVar17 != (optimistic_lock *)0x0) {
                  LOCK();
                  (db_instance->shrinking_inode_counts)._M_elems[0].
                  super___atomic_base<unsigned_long>._M_i =
                       (db_instance->shrinking_inode_counts)._M_elems[0].
                       super___atomic_base<unsigned_long>._M_i + 1;
                  UNLOCK();
                  uVar10 = 1;
                  uVar16 = 1;
                  goto LAB_0022b219;
                }
                goto LAB_0022b334;
              }
              optimistic_lock::write_guard::~write_guard(&local_58);
            }
            optimistic_lock::write_guard::~write_guard(&child_guard_1);
          }
          optimistic_lock::write_guard::~write_guard(&local_38);
        }
        else {
          poVar17 = parent_critical_section->lock;
          _Var4 = (parent_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0022b56b;
          _Var5 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          if (_Var4 != _Var5) {
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar2 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
            goto LAB_0022b54c;
            if (_Var4 != _Var5) goto LAB_0022b36b;
          }
          LOCK();
          paVar1 = &poVar17->read_lock_count;
          lVar2 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) goto LAB_0022b54c;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (_Var4 == _Var5) {
            bVar9 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            uVar16 = 0;
            local_80._M_i = 0;
            if (bVar9) {
              local_80._M_i = (__int_type_conflict)node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if ((optimistic_lock *)local_80._M_i != (optimistic_lock *)0x0) {
              bVar9 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              poVar17 = (optimistic_lock *)0x0;
              if (bVar9) {
                poVar17 = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              local_38.lock = poVar17;
              if (poVar17 != (optimistic_lock *)0x0) {
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar17->version);
                pVar13 = pthread_self();
                (poVar17->obsoleter_thread)._M_thread = pVar13;
                local_38.lock = (optimistic_lock *)0x0;
                olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                remove(inode,(char *)(ulong)child_to_delete);
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
              }
              uVar16 = (ushort)(poVar17 != (optimistic_lock *)0x0);
              optimistic_lock::write_guard::~write_guard(&local_38);
            }
            optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff80);
            goto LAB_0022b0c3;
          }
        }
      }
    }
    else {
      node_critical_section->lock = (optimistic_lock *)0x0;
    }
LAB_0022b334:
    uVar10 = 0;
    uVar16 = 0;
  }
LAB_0022b219:
  return (_Optional_base<bool,_true,_true>)(uVar10 | uVar16 << 8);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}